

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O0

bool checkCreterion(Mesh *mesh,VectorXd *x,double epsilon)

{
  bool bVar1;
  reference pvVar2;
  ConstEdgeRange params;
  reference pvVar3;
  CoeffReturnType pdVar4;
  double *pdVar5;
  CoeffReturnType pdVar6;
  pointer ppVar7;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RSI;
  AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double dVar10;
  ConstFaceVertexRange CVar11;
  undefined1 auVar12 [16];
  double dis;
  _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true> itr;
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  itr_pr;
  int y;
  int xs;
  int y_end;
  int y_st;
  int x_end;
  int x_st;
  int end;
  int st;
  value_type e;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __end1_1;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __begin1_1;
  ConstEdgeRange *__range1_1;
  double det;
  double x11;
  double x01;
  double x10;
  double x00;
  Vec2d e2;
  double yc;
  double xc;
  Vec2d e1;
  value_type v;
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  __end2;
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  __begin2;
  ConstFaceVertexRange *__range2;
  int count;
  Vec2d u2;
  Vec2d u1;
  Vec3d pos3d [3];
  Vec2d param [3];
  VertexHandle vs [3];
  value_type f;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __end1;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin1;
  ConstFaceRange *__range1;
  AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
  *in_stack_fffffffffffffbe8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_stack_fffffffffffffbf0;
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  *in_stack_fffffffffffffbf8;
  AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
  *this;
  BaseHandle _heh;
  AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
  *in_stack_fffffffffffffc00;
  PolyConnectivity *in_stack_fffffffffffffc08;
  VectorT<double,_3> *in_stack_fffffffffffffc10;
  CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
  *in_stack_fffffffffffffc18;
  double in_stack_fffffffffffffc40;
  VectorXd *in_stack_fffffffffffffc48;
  Mesh *in_stack_fffffffffffffc50;
  VectorT<double,_3> *local_390;
  VectorT<double,_2> *local_378;
  BaseHandle *local_360;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> local_348;
  VectorT<int,2> local_340 [8];
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  local_338;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  int local_310;
  BaseHandle local_30c;
  BaseHandle local_308;
  int local_304;
  int local_300;
  BaseHandle local_2fc;
  BaseHandle local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  undefined1 local_2e8 [16];
  Mesh *mesh_00;
  VectorT<double,2> local_188 [16];
  int local_178;
  BaseHandle local_174 [13];
  PolyConnectivity *local_140;
  BaseHandle local_138;
  int local_12c;
  PolyConnectivity *local_128;
  BaseHandle local_120;
  PolyConnectivity **local_118;
  BaseHandle local_10c;
  container local_108;
  container local_f8;
  VectorT<double,_3> local_e8 [3];
  undefined1 auStack_a0 [16];
  undefined8 auStack_90 [5];
  undefined1 auStack_68 [20];
  BaseHandle local_54;
  undefined1 local_50 [16];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  local_40 [16];
  PolyConnectivity *local_30;
  PolyConnectivity **local_28;
  double local_20;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_18;
  AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
  *local_10;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  local_10 = in_RDI;
  initHashMap(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  local_30 = (PolyConnectivity *)
             OpenMesh::PolyConnectivity::all_faces
                       (&in_stack_fffffffffffffbe8->super_PolyConnectivity);
  local_28 = &local_30;
  local_40 = (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               [16])OpenMesh::PolyConnectivity::
                    EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
                    ::begin((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
                             *)in_stack_fffffffffffffbf0);
  local_50 = OpenMesh::PolyConnectivity::
             EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
             ::end((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
                    *)in_stack_fffffffffffffbf0);
  while( true ) {
    bVar1 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)in_stack_fffffffffffffbf0,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)in_stack_fffffffffffffbe8);
    if (!bVar1) {
      params = OpenMesh::PolyConnectivity::all_edges
                         (&in_stack_fffffffffffffbe8->super_PolyConnectivity);
      mesh_00 = (Mesh *)&stack0xfffffffffffffd38;
      auVar12 = OpenMesh::PolyConnectivity::
                EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                ::begin((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                         *)in_stack_fffffffffffffbf0);
      local_2e8 = OpenMesh::PolyConnectivity::
                  EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                  ::end((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                         *)in_stack_fffffffffffffbf0);
      do {
        bVar1 = OpenMesh::Iterators::
                GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                              *)in_stack_fffffffffffffbf0,
                             (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                              *)in_stack_fffffffffffffbe8);
        if (!bVar1) {
          return true;
        }
        pvVar3 = OpenMesh::Iterators::
                 GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                 ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                              *)&stack0xfffffffffffffd28);
        local_2f0 = (pvVar3->super_BaseHandle).idx_;
        local_2ec = local_2f0;
        bVar1 = OpenMesh::PolyConnectivity::is_boundary
                          (in_stack_fffffffffffffc08,
                           (BaseHandle)(int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
        _heh.idx_ = (int)in_stack_fffffffffffffc00;
        if (bVar1) {
          local_300 = local_2ec;
          this = local_10;
          local_2fc.idx_ =
               (int)OpenMesh::ArrayKernel::halfedge_handle
                              ((ArrayKernel *)in_stack_fffffffffffffbe8,
                               (BaseHandle)(int)in_stack_fffffffffffffbf0,0);
          local_2f8.idx_ =
               (int)OpenMesh::ArrayKernel::from_vertex_handle((ArrayKernel *)this,_heh.idx_);
          local_2f4 = OpenMesh::BaseHandle::idx(&local_2f8);
          local_310 = local_2ec;
          in_stack_fffffffffffffc00 = local_10;
          local_30c.idx_ =
               (int)OpenMesh::ArrayKernel::halfedge_handle
                              ((ArrayKernel *)in_stack_fffffffffffffbe8,
                               (BaseHandle)(int)in_stack_fffffffffffffbf0,0);
          local_308.idx_ =
               (int)OpenMesh::ArrayKernel::to_vertex_handle
                              ((ArrayKernel *)in_stack_fffffffffffffbe8,
                               (BaseHandle)(int)in_stack_fffffffffffffbf0);
          local_304 = OpenMesh::BaseHandle::idx(&local_308);
          in_stack_fffffffffffffc08 =
               (PolyConnectivity *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
          pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
          pdVar5 = std::min<double>((double *)in_stack_fffffffffffffc08,pdVar4);
          local_314 = (int)(*pdVar5 / local_20 - 1.0);
          in_stack_fffffffffffffc10 =
               (VectorT<double,_3> *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
          pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
          pdVar5 = std::max<double>((double *)in_stack_fffffffffffffc10,pdVar4);
          local_318 = (int)(*pdVar5 / local_20 + 1.0);
          pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
          pdVar5 = std::min<double>(pdVar4,pdVar6);
          local_31c = (int)(*pdVar5 / local_20 - 1.0);
          pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
          pdVar5 = std::max<double>(pdVar4,pdVar6);
          local_320 = (int)(*pdVar5 / local_20 + 1.0);
          for (local_324 = local_314; local_324 <= local_318; local_324 = local_324 + 1) {
            for (local_328 = local_31c; local_328 <= local_320; local_328 = local_328 + 1) {
              OpenMesh::VectorT<int,2>::VectorT<int,int,void,void>(local_340,local_324,local_328);
              local_338 = std::
                          unordered_multimap<OpenMesh::VectorT<int,_2>,_int,_myHash,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>_>
                          ::equal_range((unordered_multimap<OpenMesh::VectorT<int,_2>,_int,_myHash,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>_>
                                         *)in_stack_fffffffffffffbf0,
                                        (key_type *)in_stack_fffffffffffffbe8);
              local_348 = local_338.first.
                          super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                          ._M_cur;
              while( true ) {
                bVar1 = std::__detail::operator!=
                                  (&local_348,
                                   &local_338.second.
                                    super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                  );
                if (!bVar1) break;
                ppVar7 = std::__detail::
                         _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                         ::operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                       *)0x1d1d54);
                if (ppVar7->second != local_2f4) {
                  ppVar7 = std::__detail::
                           _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                           ::operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                         *)0x1d1d71);
                  if (ppVar7->second != local_304) {
                    in_stack_fffffffffffffbe8 = local_10;
                    in_stack_fffffffffffffbf0 = local_18;
                    std::__detail::
                    _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>::
                    operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                *)0x1d1da3);
                    OpenMesh::VertexHandle::VertexHandle
                              ((VertexHandle *)in_stack_fffffffffffffbf0,
                               (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
                    dVar10 = getDistance(mesh_00,(VectorXd *)params.container_,auVar12._8_8_,
                                         auVar12._0_8_);
                    if ((dVar10 == 0.0) && (!NAN(dVar10))) {
                      return false;
                    }
                  }
                }
                std::__detail::
                _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>::
                operator++((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                            *)in_stack_fffffffffffffbf0);
              }
            }
          }
        }
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                      *)in_stack_fffffffffffffbf0);
      } while( true );
    }
    pvVar2 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
             ::operator*(local_40);
    local_54.idx_ = (pvVar2->super_BaseHandle).idx_;
    local_360 = (BaseHandle *)(auStack_68 + 8);
    do {
      OpenMesh::VertexHandle::VertexHandle
                ((VertexHandle *)in_stack_fffffffffffffbf0,
                 (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      local_360 = local_360 + 1;
    } while (local_360 != &local_54);
    local_378 = (VectorT<double,_2> *)(auStack_a0 + 8);
    do {
      OpenMesh::VectorT<double,_2>::VectorT(local_378);
      local_378 = local_378 + 1;
    } while (local_378 != (VectorT<double,_2> *)auStack_68);
    local_390 = local_e8;
    do {
      OpenMesh::VectorT<double,_3>::VectorT(local_390);
      local_390 = local_390 + 1;
    } while (local_390 != (VectorT<double,_3> *)auStack_a0);
    local_f8._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator-
                          ((VectorT<double,_2> *)in_stack_fffffffffffffbf8,
                           (VectorT<double,_2> *)in_stack_fffffffffffffbf0);
    local_108._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator-
                          ((VectorT<double,_2> *)in_stack_fffffffffffffbf8,
                           (VectorT<double,_2> *)in_stack_fffffffffffffbf0);
    pdVar5 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_fffffffffffffbf0,
                        (size_t)in_stack_fffffffffffffbe8);
    dVar10 = *pdVar5;
    pdVar5 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_fffffffffffffbf0,
                        (size_t)in_stack_fffffffffffffbe8);
    dVar8 = *pdVar5;
    pdVar5 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_fffffffffffffbf0,
                        (size_t)in_stack_fffffffffffffbe8);
    dVar9 = *pdVar5;
    pdVar5 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_fffffffffffffbf0,
                        (size_t)in_stack_fffffffffffffbe8);
    if ((dVar10 * dVar8 == dVar9 * *pdVar5) && (!NAN(dVar10 * dVar8) && !NAN(dVar9 * *pdVar5)))
    break;
    local_10c.idx_ = 0;
    local_12c = local_54.idx_;
    CVar11 = OpenMesh::PolyConnectivity::fv_range
                       (&in_stack_fffffffffffffbe8->super_PolyConnectivity,
                        (BaseHandle)(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
    local_140 = CVar11.container_;
    local_138.idx_ = (int)CVar11.center_.super_BaseHandle.idx_;
    local_118 = &local_128;
    local_128 = local_140;
    local_120.idx_ = local_138.idx_;
    OpenMesh::PolyConnectivity::
    CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
    ::begin(in_stack_fffffffffffffc18);
    OpenMesh::PolyConnectivity::
    CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
    ::end(in_stack_fffffffffffffc18);
    while( true ) {
      bVar1 = OpenMesh::Iterators::
              GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
              ::operator!=((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                            *)in_stack_fffffffffffffbf0,
                           (GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                            *)in_stack_fffffffffffffbe8);
      if (!bVar1) break;
      local_178 = (int)OpenMesh::Iterators::
                       GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                       ::operator*(in_stack_fffffffffffffbf8);
      ((BaseHandle *)(auStack_68 + (long)local_10c.idx_ * 4 + 8))->idx_ = local_178;
      local_174[0].idx_ = local_178;
      OpenMesh::
      AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
      ::point(in_stack_fffffffffffffbe8,(BaseHandle)(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20))
      ;
      OpenMesh::VectorT<double,3>::operator=
                (in_stack_fffffffffffffc10,(VectorT<float,_3> *)in_stack_fffffffffffffc08);
      OpenMesh::BaseHandle::idx(local_174);
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
      dVar10 = *pdVar4;
      OpenMesh::BaseHandle::idx(local_174);
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         (in_stack_fffffffffffffbf0,(Index)in_stack_fffffffffffffbe8);
      OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_188,dVar10,*pdVar4);
      *(undefined8 *)(auStack_a0 + (long)local_10c.idx_ * 0x10 + 8) = local_188._0_8_;
      auStack_90[(long)local_10c.idx_ * 2] = local_188._8_8_;
      local_10c.idx_ = local_10c.idx_ + 1;
      OpenMesh::Iterators::
      GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator++((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    *)in_stack_fffffffffffffbf0);
    }
    OpenMesh::VectorT<double,2>::operator-
              ((VectorT<double,_2> *)in_stack_fffffffffffffbf8,
               (VectorT<double,_2> *)in_stack_fffffffffffffbf0);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_fffffffffffffc10,(VectorT<double,_3> *)in_stack_fffffffffffffc08);
    OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1d1661);
    OpenMesh::VectorT<double,2>::operator/
              ((VectorT<double,_2> *)in_stack_fffffffffffffbf8,(double *)in_stack_fffffffffffffbf0);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_fffffffffffffc10,(VectorT<double,_3> *)in_stack_fffffffffffffc08);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_fffffffffffffc10,(VectorT<double,_3> *)in_stack_fffffffffffffc08);
    dVar10 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_fffffffffffffbf0,
                        (VectorT<double,_3> *)in_stack_fffffffffffffbe8);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_fffffffffffffc10,(VectorT<double,_3> *)in_stack_fffffffffffffc08);
    dVar8 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1d171c);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_fffffffffffffc10,(VectorT<double,_3> *)in_stack_fffffffffffffc08);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_fffffffffffffc10,(VectorT<double,_3> *)in_stack_fffffffffffffc08);
    dVar9 = OpenMesh::dot<double,3>
                      ((VectorT<double,_3> *)in_stack_fffffffffffffbf0,
                       (VectorT<double,_3> *)in_stack_fffffffffffffbe8);
    sqrt(-(dVar10 / dVar8) * (dVar10 / dVar8) + dVar9);
    OpenMesh::VectorT<double,2>::operator-
              ((VectorT<double,_2> *)in_stack_fffffffffffffbf8,
               (VectorT<double,_2> *)in_stack_fffffffffffffbf0);
    OpenMesh::VectorT<double,2>::operator*
              ((VectorT<double,_2> *)in_stack_fffffffffffffbf8,(double *)in_stack_fffffffffffffbf0);
    OpenMesh::VectorT<double,2>::operator-
              ((VectorT<double,_2> *)in_stack_fffffffffffffbf8,
               (VectorT<double,_2> *)in_stack_fffffffffffffbf0);
    OpenMesh::VectorT<double,2>::operator/
              ((VectorT<double,_2> *)in_stack_fffffffffffffbf8,(double *)in_stack_fffffffffffffbf0);
    pdVar5 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_fffffffffffffbf0,
                        (size_t)in_stack_fffffffffffffbe8);
    dVar10 = *pdVar5;
    pdVar5 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_fffffffffffffbf0,
                        (size_t)in_stack_fffffffffffffbe8);
    dVar8 = *pdVar5;
    pdVar5 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_fffffffffffffbf0,
                        (size_t)in_stack_fffffffffffffbe8);
    dVar9 = *pdVar5;
    pdVar5 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_fffffffffffffbf0,
                        (size_t)in_stack_fffffffffffffbe8);
    if (dVar10 * *pdVar5 + -(dVar9 * dVar8) < 0.0) {
      return false;
    }
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)in_stack_fffffffffffffbf0);
  }
  return false;
}

Assistant:

bool checkCreterion(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    initHashMap(mesh, x, epsilon);
    for (auto f: mesh.all_faces()) {
        // get the vertices associated with this triangle
        OpenMesh::VertexHandle vs[3];
        OpenMesh::Vec2d param[3];
        OpenMesh::Vec3d pos3d[3];
        OpenMesh::Vec2d u1 = param[1] - param[0];
        OpenMesh::Vec2d u2 = param[2] - param[0];

        if (u2[1] * u1[0] == u2[0] * u1[1])
            return false;

        int count = 0;
        for (auto v: mesh.fv_range(f)) {
            vs[count] = v;
            pos3d[count] = mesh.point(v);
            param[count] = OpenMesh::Vec2d(x[v.idx() * 2], x[v.idx() * 2 + 1]);
            ++count;
        }
        // check non-flip and bijective
        OpenMesh::Vec2d e1 = (param[1] - param[0]) / (pos3d[1] - pos3d[0]).norm();
        double xc = OpenMesh::dot(pos3d[2] - pos3d[0], pos3d[1] - pos3d[0]) / (pos3d[1] - pos3d[0]).norm();
        double yc = sqrt(OpenMesh::dot(pos3d[2] - pos3d[0], pos3d[2] - pos3d[0]) - xc * xc);
        OpenMesh::Vec2d e2 =  (param[2] - param[0] - e1 * xc) / yc; 
        double x00 = e1[0];
        double x10 = e1[1];
        double x01 = e2[0];
        double x11 = e2[1];
        double det = x00 * x11 - x01 * x10;
        if (det < 0.0)
            return false;
    }

    // check the degeneration of boundary points
    for (auto e: mesh.all_edges())
        if (mesh.is_boundary(e)) {
            int st = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            int end = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            // The range for neighborhood searching
            int x_st = std::min(x[2 * st], x[2 * end]) / epsilon - 1;
            int x_end = std::max(x[2 * st], x[2 * end]) / epsilon + 1;
            int y_st = std::min(x[2 * st + 1], x[2 * end + 1]) / epsilon - 1;
            int y_end = std::max(x[2 * st + 1], x[2 * end + 1]) / epsilon + 1;
            // conduct neighbor search for neighbor boundaries points
            for (int xs = x_st; xs <= x_end; ++xs)
                for (int y = y_st; y <= y_end; ++y) {
                    auto itr_pr = neighbors.equal_range(OpenMesh::Vec2i(xs, y));
                    for (auto itr = itr_pr.first; itr != itr_pr.second; ++itr)
                        if (itr->second != st && itr->second != end) {
                            double dis = getDistance(mesh, x, e, OpenMesh::VertexHandle(itr->second));
                            if (dis == 0.0)
                                return false;
                        }
                    }
        }
    return true;
}